

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_connectionsPersistAfterImporting_Test::TestBody
          (Variable_connectionsPersistAfterImporting_Test *this)

{
  string sVar1;
  void *pvVar2;
  shared_ptr *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char cVar4;
  char *pcVar5;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  VariablePtr x1;
  VariablePtr x2;
  ComponentPtr importedComponent;
  ImporterPtr importer;
  ImportSourcePtr importSource;
  AssertionResult local_108;
  long local_f8 [2];
  shared_ptr<libcellml::Variable> local_e8;
  long local_d8 [2];
  shared_ptr<libcellml::Component> local_c8;
  long local_b8 [2];
  shared_ptr<libcellml::Component> local_a8;
  shared_ptr<libcellml::Variable> local_98;
  void *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  shared_ptr *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  void *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"model","");
  libcellml::Model::create((string *)&local_78);
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_40,0));
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::Component::create((string *)&local_50);
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  libcellml::ComponentEntity::addComponent(local_78);
  libcellml::ImportSource::create();
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"importedModelWithMaps.cellml","");
  libcellml::ImportSource::setUrl(local_30);
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_50 + 0x10));
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importMe","");
  libcellml::ImportedEntity::setImportReference((string *)(local_50 + 0x10));
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  cVar4 = libcellml::Model::hasUnresolvedImports();
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _1_7_,cVar4);
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(char *)&local_e8,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x738,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_108._0_8_ != local_f8) {
      operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
    }
    if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_c8.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = "";
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"","");
  resourcePath((string *)&local_108);
  libcellml::Importer::resolveImports(local_40,(string *)&local_78);
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  cVar4 = libcellml::Model::hasUnresolvedImports();
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ._1_7_,cVar4) ^ 1);
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(char *)&local_e8,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x73a,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_108._0_8_ != local_f8) {
      operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
    }
    if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_c8.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::flattenModel((shared_ptr *)&local_108);
  this_00 = pbStack_70;
  pbStack_70 = local_108.message_.ptr_;
  local_78 = (shared_ptr *)local_108._0_8_;
  local_108._0_8_ = (long *)0x0;
  local_108.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    if (local_108.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.message_.ptr_);
    }
  }
  psVar3 = local_78;
  local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component((string *)&local_c8,SUB81(psVar3,0));
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)&local_e8,"nullptr","model->component(\"importedComponent\")",
             (void **)&local_a8,&local_c8);
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = *(char **)local_e8.
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x73e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((long *)local_108._0_8_ != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_108._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_78;
  local_88 = (void *)0x0;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component((string *)&local_98,SUB81(psVar3,0));
  sVar1 = local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"child1","");
  libcellml::ComponentEntity::component((string *)&local_a8,(bool)sVar1);
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)&local_c8,"nullptr",
             "model->component(\"importedComponent\")->component(\"child1\")",&local_88,&local_a8);
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  if (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x73f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_108._0_8_ != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_108._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_78;
  local_88 = (void *)0x0;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component((string *)&local_98,SUB81(psVar3,0));
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"child2","");
  libcellml::ComponentEntity::component
            ((string *)&local_a8,
             (bool)local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._0_1_);
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)&local_c8,"nullptr",
             "model->component(\"importedComponent\")->component(\"child2\")",&local_88,&local_a8);
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  if (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x740,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_108._0_8_ != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_108._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_78;
  local_58 = (void *)0x0;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component(local_68,SUB81(psVar3,0));
  sVar1 = local_68[0];
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"child1","");
  libcellml::ComponentEntity::component((string *)&local_88,(bool)sVar1);
  local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"x","");
  libcellml::Component::variable((string *)&local_98);
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_a8,"nullptr",
             "model->component(\"importedComponent\")->component(\"child1\")->variable(\"x\")",
             &local_58,&local_98);
  if (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_b8) {
    operator_delete(local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_b8[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_a8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x741,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_108._0_8_ != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_108._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_78;
  local_58 = (void *)0x0;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component(local_68,SUB81(psVar3,0));
  sVar1 = local_68[0];
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"child2","");
  libcellml::ComponentEntity::component((string *)&local_88,(bool)sVar1);
  local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"x","");
  libcellml::Component::variable((string *)&local_98);
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_a8,"nullptr",
             "model->component(\"importedComponent\")->component(\"child2\")->variable(\"x\")",
             &local_58,&local_98);
  if (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_b8) {
    operator_delete(local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_b8[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_a8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x742,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_108._0_8_ != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_108._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_78;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component((string *)&local_88,SUB81(psVar3,0));
  pvVar2 = local_88;
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"child1","");
  libcellml::ComponentEntity::component((string *)&local_98,SUB81(pvVar2,0));
  local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"x","");
  libcellml::Component::variable((string *)&local_a8);
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_b8) {
    operator_delete(local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_b8[0] + 1);
  }
  if (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  psVar3 = local_78;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"importedComponent","");
  libcellml::ComponentEntity::component(local_68,SUB81(psVar3,0));
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"child2","");
  libcellml::ComponentEntity::component((string *)&local_88,(bool)local_68[0]);
  local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"x","");
  libcellml::Component::variable((string *)&local_98);
  if (local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_b8) {
    operator_delete(local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_b8[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_d8) {
    operator_delete(local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_d8[0] + 1);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((long *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8[0] + 1);
  }
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_108,"size_t(1)","x1->equivalentVariableCount()",
             (unsigned_long *)&local_e8,(unsigned_long *)&local_c8);
  if ((string)local_108.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_108.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_108.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x746,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_e8.
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Variable::equivalentVariableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_108,"size_t(1)","x2->equivalentVariableCount()",
             (unsigned_long *)&local_e8,(unsigned_long *)&local_c8);
  if ((string)local_108.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_108.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_108.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x747,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_e8.
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::Variable::equivalentVariable((ulong)&local_e8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_108,"x1","x2->equivalentVariable(0)",
             (shared_ptr<libcellml::Variable> *)&local_a8,&local_e8);
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_108.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_108.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_108.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x748,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_e8.
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::Variable::equivalentVariable((ulong)&local_e8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_108,"x2","x1->equivalentVariable(0)",&local_98,&local_e8);
  if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_108.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_108.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_108.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x749,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_e8.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_e8.
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_70);
  }
  return;
}

Assistant:

TEST(Variable, setInitialValueByDouble)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable initial_value=\"0\"/>\n"
        "  </component>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v = libcellml::Variable::create();
    double value = 0.0;
    v->setInitialValue(value);
    c->addVariable(v);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}